

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double getVariance(Mat *inputImg,int y,int x)

{
  _InputArray *p_Var1;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  _OutputArray local_1b0;
  _OutputArray local_198;
  _InputArray local_180;
  undefined1 local_168 [8];
  Scalar stddev;
  Scalar mean;
  Rect_<int> local_100;
  _OutputArray local_f0 [4];
  int local_90;
  int local_8c;
  int width;
  int length;
  Mat tempMat;
  int upperBoundX;
  int lowerBoundX;
  int upperBoundY;
  int lowerBoundY;
  int x_local;
  int y_local;
  Mat *inputImg_local;
  
  local_1b4 = y;
  if (-1 < y + -1) {
    local_1b4 = y + -1;
  }
  local_1b8 = y;
  if (y + 1 < *(int *)(inputImg + 8)) {
    local_1b8 = y + 1;
  }
  local_1bc = x;
  if (-1 < x + -1) {
    local_1bc = x + -1;
  }
  local_1c0 = x;
  if (x + 1 < *(int *)(inputImg + 0xc)) {
    local_1c0 = x + 1;
  }
  cv::Mat::Mat((Mat *)&width);
  local_8c = (local_1b8 - local_1b4) + 1;
  local_90 = (local_1c0 - local_1bc) + 1;
  cv::Rect_<int>::Rect_(&local_100,local_1bc,local_1b4,local_90,local_8c);
  cv::Mat::operator()((Mat *)local_f0,(Rect *)inputImg);
  cv::_OutputArray::_OutputArray
            ((_OutputArray *)(mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
             (Mat *)&width);
  cv::Mat::copyTo(local_f0);
  cv::_OutputArray::~_OutputArray
            ((_OutputArray *)(mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)(stddev.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_168);
  cv::_InputArray::_InputArray(&local_180,(Mat *)&width);
  cv::_OutputArray::_OutputArray<double,4,1>
            (&local_198,
             (Matx<double,_4,_1> *)(stddev.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3));
  cv::_OutputArray::_OutputArray<double,4,1>(&local_1b0,(Matx<double,_4,_1> *)local_168);
  p_Var1 = (_InputArray *)cv::noArray();
  cv::meanStdDev(&local_180,&local_198,&local_1b0,p_Var1);
  cv::_OutputArray::~_OutputArray(&local_1b0);
  cv::_OutputArray::~_OutputArray(&local_198);
  cv::_InputArray::~_InputArray(&local_180);
  cv::Mat::~Mat((Mat *)&width);
  return (double)local_168 * (double)local_168;
}

Assistant:

double getVariance(Mat &inputImg, int y , int x) {
    int lowerBoundY = y -1 >=  0? y -1 : y;
    int upperBoundY = y + 1 < inputImg.rows? y + 1 : y;
    int lowerBoundX = x - 1 >= 0? x -1  :  x;
    int upperBoundX = x + 1 < inputImg.cols? x + 1 : x;
    Mat tempMat;
    int length = (upperBoundY - lowerBoundY) + 1;
    int width = (upperBoundX - lowerBoundX) + 1;
    inputImg(Rect(lowerBoundX, lowerBoundY, width, length)).copyTo(tempMat);
    Scalar mean, stddev;
    meanStdDev(tempMat, mean, stddev);
    return stddev.val[0] * stddev.val[0];
}